

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O3

String * __thiscall indigox::Atom::ToString_abi_cxx11_(String *__return_storage_ptr__,Atom *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," \"",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" @ (",5);
  poVar1 = std::ostream::_M_insert<double>((double)(this->pos_)._M_elems[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  std::ostream::_M_insert<double>((double)(this->pos_)._M_elems[1]);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,",",1);
  poVar1 = std::ostream::_M_insert<double>((double)(this->pos_)._M_elems[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

String Atom::ToString() {
    std::stringstream ss;
    ss << idx_ << " \"" << name_ << "\" @ (" << pos_[0] << "," << pos_[1] ;
    ss << "," << pos_[2] << ")";
    return ss.str();
  }